

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_setuid_setgid(void)

{
  int iVar1;
  passwd *ppVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_uid_t uid;
  char gidstr [10];
  char uidstr [10];
  passwd *pw;
  int r;
  
  eval_a._0_4_ = getuid();
  if ((__uid_t)eval_a == 0) {
    init_process_options("spawn_helper_setuid_setgid",exit_cb);
    ppVar2 = getpwnam("nobody");
    if (ppVar2 == (passwd *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
              ,0x5c2,"pw","!=","NULL",0,"!=",0);
      abort();
    }
    options.uid = ppVar2->pw_uid;
    options.gid = ppVar2->pw_gid;
    snprintf(gidstr + 2,10,"%d",(ulong)ppVar2->pw_uid);
    snprintf((char *)((long)&eval_a + 4),10,"%d",(ulong)ppVar2->pw_gid);
    options.args[2] = gidstr + 2;
    options.args[3] = (char *)((long)&eval_a + 4);
    options.flags = 3;
    uVar3 = uv_default_loop();
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 == -0xd) {
      fprintf(_stderr,"%s\n","user \'nobody\' cannot access the test runner");
      fflush(_stderr);
      pw._4_4_ = 7;
    }
    else {
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x5cf,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      uVar3 = uv_default_loop();
      iVar1 = uv_run(uVar3,0);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x5d2,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      if ((long)exit_cb_called != 1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x5d4,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
        abort();
      }
      if ((long)close_cb_called != 1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x5d5,"1","==","close_cb_called",1,"==",(long)close_cb_called);
        abort();
      }
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x5d7,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
        abort();
      }
      uv_library_shutdown();
      pw._4_4_ = 0;
    }
  }
  else {
    fprintf(_stderr,"%s\n","It should be run as root user");
    fflush(_stderr);
    pw._4_4_ = 7;
  }
  return pw._4_4_;
}

Assistant:

TEST_IMPL(spawn_setuid_setgid) {
  int r;
  struct passwd* pw;
  char uidstr[10];
  char gidstr[10];

  /* if not root, then this will fail. */
  uv_uid_t uid = getuid();
  if (uid != 0) {
    RETURN_SKIP("It should be run as root user");
  }

  init_process_options("spawn_helper_setuid_setgid", exit_cb);

  /* become the "nobody" user. */
  pw = getpwnam("nobody");
  ASSERT_NOT_NULL(pw);
  options.uid = pw->pw_uid;
  options.gid = pw->pw_gid;
  snprintf(uidstr, sizeof(uidstr), "%d", pw->pw_uid);
  snprintf(gidstr, sizeof(gidstr), "%d", pw->pw_gid);
  options.args[2] = uidstr;
  options.args[3] = gidstr;
  options.flags = UV_PROCESS_SETUID | UV_PROCESS_SETGID;

  r = uv_spawn(uv_default_loop(), &process, &options);
  if (r == UV_EACCES)
    RETURN_SKIP("user 'nobody' cannot access the test runner");

  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}